

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err http_sconn_init(http_sconn **scp,nng_stream *stream)

{
  http_sconn *sc_00;
  nng_err rv;
  http_sconn *sc;
  nng_stream *stream_local;
  http_sconn **scp_local;
  
  sc_00 = (http_sconn *)nni_zalloc(0x7a0);
  if (sc_00 == (http_sconn *)0x0) {
    nng_stream_free(stream);
    scp_local._4_4_ = NNG_ENOMEM;
  }
  else {
    nni_aio_init(&sc_00->rxaio,http_sconn_rxdone,sc_00);
    nni_aio_init(&sc_00->txaio,http_sconn_txdone,sc_00);
    nni_aio_init(&sc_00->txdataio,http_sconn_txdatdone,sc_00);
    nni_aio_init(&sc_00->cbaio,http_sconn_cbdone,sc_00);
    scp_local._4_4_ = nni_http_init(&sc_00->conn,stream,false);
    if (scp_local._4_4_ == NNG_OK) {
      nni_http_conn_set_ctx(sc_00->conn,sc_00);
      *scp = sc_00;
      scp_local._4_4_ = NNG_OK;
    }
    else {
      http_sconn_close(sc_00);
    }
  }
  return scp_local._4_4_;
}

Assistant:

static nng_err
http_sconn_init(http_sconn **scp, nng_stream *stream)
{
	http_sconn *sc;
	nng_err     rv;

	if ((sc = NNI_ALLOC_STRUCT(sc)) == NULL) {
		nng_stream_free(stream);
		return (NNG_ENOMEM);
	}

	nni_aio_init(&sc->rxaio, http_sconn_rxdone, sc);
	nni_aio_init(&sc->txaio, http_sconn_txdone, sc);
	nni_aio_init(&sc->txdataio, http_sconn_txdatdone, sc);
	nni_aio_init(&sc->cbaio, http_sconn_cbdone, sc);

	if ((rv = nni_http_init(&sc->conn, stream, false)) != 0) {
		// Can't even accept the incoming request.  Hard close.
		http_sconn_close(sc);
		return (rv);
	}

	nni_http_conn_set_ctx(sc->conn, sc);
	*scp = sc;
	return (NNG_OK);
}